

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64wd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *out,int_t *pr,int_t *q,int_t *l,double *u,double *d__)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint *pos0;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int_t *piVar10;
  double *pdVar11;
  int *piVar12;
  int_t *piVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  uint local_d8;
  uint local_d4;
  double *local_d0;
  int_t *local_c8;
  int_t c__2;
  double local_b8;
  int *local_b0;
  ulong local_a8;
  uint local_a0;
  int_t local_9c;
  int_t *local_98;
  double local_90;
  int_t *local_88;
  int_t *local_80;
  int_t *local_78;
  double local_70;
  double local_68;
  ulong local_60;
  int local_58;
  int local_54;
  uint *local_50;
  long local_48;
  ulong local_40;
  int_t *local_38;
  
  local_98 = out;
  c__2 = 2;
  local_88 = l + -1;
  piVar13 = jperm + -1;
  local_d0 = a;
  local_c8 = irn;
  dVar18 = dmach("Overflow");
  *num = 0;
  uVar4 = 0;
  uVar5 = (ulong)(uint)*n;
  if (*n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 4 != uVar4; uVar4 = uVar4 + 4) {
    *(double *)((long)u + uVar4 * 2) = dVar18;
    *(undefined8 *)((long)d__ + uVar4 * 2) = 0;
    *(undefined4 *)((long)iperm + uVar4) = 0;
    *(undefined4 *)((long)jperm + uVar4) = 0;
    *(undefined4 *)((long)pr + uVar4) = *(undefined4 *)((long)ip + uVar4);
    *(undefined4 *)((long)l + uVar4) = 0;
    ne = pr;
  }
  iVar2 = 0;
  if (0 < *n) {
    iVar2 = *n;
  }
  uVar5 = 1;
  while (uVar4 = uVar5, uVar4 != iVar2 + 1) {
    ne = (int_t *)(long)ip[uVar4];
    for (lVar8 = (long)ip[uVar4 - 1]; uVar5 = uVar4 + 1, lVar8 < (long)ne; lVar8 = lVar8 + 1) {
      lVar9 = (long)local_c8[lVar8 + -1];
      dVar20 = local_d0[lVar8 + -1];
      if (dVar20 < u[lVar9 + -1] || dVar20 == u[lVar9 + -1]) {
        u[lVar9 + -1] = dVar20;
        iperm[lVar9 + -1] = (int)uVar4;
        local_88[lVar9] = (int_t)lVar8;
      }
    }
  }
  uVar4 = 0;
  uVar5 = (ulong)(uint)*n;
  if (*n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = iperm[uVar4];
    lVar8 = (long)iVar2;
    if ((lVar8 != 0) && (iperm[uVar4] = 0, piVar13[lVar8] == 0)) {
      *num = *num + 1;
      iperm[uVar4] = iVar2;
      ne = (int_t *)(ulong)(uint)l[uVar4];
      piVar13[lVar8] = l[uVar4];
    }
  }
  local_98 = local_98 + -1;
  uVar15 = *num;
  uVar14 = *n;
  piVar10 = local_c8;
  pdVar11 = local_d0;
  if (uVar15 != uVar14) {
    uVar15 = 0;
    if (0 < (int)uVar14) {
      uVar15 = uVar14;
    }
    for (uVar5 = 1; uVar5 != uVar15 + 1; uVar5 = uVar5 + 1) {
      if (piVar13[uVar5] == 0) {
        uVar4 = (ulong)ip[uVar5 - 1];
        iVar2 = ip[uVar5];
        dVar20 = dVar18;
        if (ip[uVar5 - 1] < iVar2) {
          for (; (long)uVar4 < (long)iVar2; uVar4 = uVar4 + 1) {
            uVar1 = local_c8[uVar4 - 1];
            dVar19 = local_d0[uVar4 - 1] - u[(long)(int)uVar1 + -1];
            if (dVar19 <= dVar20) {
              if (dVar20 <= dVar19) {
                if (((dVar19 != dVar18) || (NAN(dVar19) || NAN(dVar18))) &&
                   ((iperm[(long)(int)uVar1 + -1] != 0 || (iperm[(long)(int)uVar14 + -1] == 0))))
                goto LAB_00111dde;
              }
              ne = (int_t *)(uVar4 & 0xffffffff);
              dVar20 = dVar19;
              uVar14 = uVar1;
            }
LAB_00111dde:
          }
          lVar8 = (long)(int)uVar14;
          d__[uVar5 - 1] = dVar20;
          uVar4 = (ulong)ne & 0xffffffff;
          if (iperm[lVar8 + -1] == 0) {
LAB_00111f14:
            *num = *num + 1;
            piVar13[uVar5] = (int)uVar4;
            iperm[lVar8 + -1] = (int)uVar5;
            pr[uVar5 - 1] = (int)uVar4 + 1;
          }
          else {
            for (uVar4 = (ulong)(int)ne; (long)uVar4 < (long)iVar2; uVar4 = uVar4 + 1) {
              lVar8 = (long)local_c8[uVar4 - 1];
              if (local_d0[uVar4 - 1] - u[lVar8 + -1] <= dVar20) {
                iVar3 = iperm[lVar8 + -1];
                lVar9 = (long)pr[(long)iVar3 + -1];
                iVar7 = ip[iVar3];
                if (pr[(long)iVar3 + -1] < iVar7) {
                  for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
                    lVar16 = (long)local_c8[lVar9 + -1];
                    if ((iperm[lVar16 + -1] < 1) &&
                       (local_d0[lVar9 + -1] - u[lVar16 + -1] <= d__[(long)iVar3 + -1])) {
                      piVar13[iVar3] = (int)lVar9;
                      iperm[lVar16 + -1] = iVar3;
                      pr[(long)iVar3 + -1] = (int)lVar9 + 1;
                      goto LAB_00111f14;
                    }
                  }
                  pr[(long)iVar3 + -1] = iVar7;
                }
              }
            }
          }
        }
      }
    }
    uVar15 = *num;
    uVar14 = *n;
    if (uVar15 != uVar14) {
      uVar4 = 0;
      uVar5 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar5 = uVar4;
      }
      uVar6 = (ulong)((int)uVar5 + 1);
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        d__[uVar4] = dVar18;
        l[uVar4] = 0;
      }
      iVar2 = *n;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      uVar5 = (ulong)(iVar2 + 1);
      local_38 = q + -2;
      local_b0 = iperm;
      local_80 = ip;
      local_78 = piVar13;
      local_70 = dVar18;
      local_40 = uVar5;
      for (local_60 = 1; local_60 != uVar5; local_60 = local_60 + 1) {
        if (piVar13[local_60] == 0) {
          iVar2 = *n;
          pr[local_60 - 1] = -1;
          iVar3 = local_80[local_60];
          uVar15 = 0;
          dVar20 = dVar18;
          local_90 = dVar18;
          for (lVar8 = (long)local_80[local_60 - 1]; lVar8 < iVar3; lVar8 = lVar8 + 1) {
            uVar14 = piVar10[lVar8 + -1];
            uVar6 = (ulong)uVar14;
            dVar19 = pdVar11[lVar8 + -1] - u[(long)(int)uVar14 + -1];
            if (dVar19 < dVar20) {
              if (iperm[(long)(int)uVar14 + -1] == 0) {
                local_a0 = (uint)local_60;
                dVar20 = dVar19;
                local_9c = (int_t)lVar8;
              }
              else {
                d__[(long)(int)uVar14 + -1] = dVar19;
                if (local_90 <= dVar19) {
                  dVar19 = local_90;
                }
                lVar9 = (long)(int)uVar15;
                uVar15 = uVar15 + 1;
                q[lVar9] = (int_t)lVar8;
                local_90 = dVar19;
              }
            }
          }
          uVar14 = iVar2 + 1;
          uVar4 = 0;
          uVar5 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar5 = uVar4;
          }
          uVar15 = 0;
          local_68 = (double)CONCAT44(local_68._4_4_,uVar14);
          local_b8 = dVar20;
          local_a8 = uVar5;
          for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
            iVar2 = q[uVar4];
            uVar1 = piVar10[(long)iVar2 + -1];
            uVar6 = (ulong)uVar1;
            local_d4 = uVar1;
            if (dVar20 <= d__[(long)(int)uVar1 + -1]) {
              d__[(long)(int)uVar1 + -1] = dVar18;
            }
            else {
              if (d__[(long)(int)uVar1 + -1] <= local_90) {
                lVar8 = (long)(int)uVar14;
                uVar14 = uVar14 - 1;
                q[lVar8 + -2] = uVar1;
                local_88[(int)uVar1] = uVar14;
              }
              else {
                uVar15 = uVar15 + 1;
                l[(long)(int)uVar1 + -1] = uVar15;
                mc64dd_((int_t *)&local_d4,n,q,d__,l,&c__2);
                iperm = local_b0;
                piVar10 = local_c8;
                pdVar11 = local_d0;
                uVar5 = local_a8;
                dVar18 = local_70;
                dVar20 = local_b8;
              }
              iVar3 = iperm[(long)(int)uVar1 + -1];
              local_98[iVar3] = iVar2;
              pr[(long)iVar3 + -1] = (int_t)local_60;
            }
          }
          local_58 = *num;
          if (local_58 < 1) {
            local_58 = 0;
          }
          local_58 = local_58 + 1;
          local_a8 = (long)local_68._0_4_;
          piVar13 = local_88;
          local_b8 = dVar20;
          local_d8 = uVar15;
          for (local_54 = 1; local_54 != local_58; local_54 = local_54 + 1) {
            if (uVar14 == (uint)local_a8) {
              if (local_d8 == 0) break;
              uVar6 = (ulong)*q;
              local_90 = d__[uVar6 - 1];
              if (local_b8 <= local_90) break;
              piVar12 = local_38 + (int)uVar14;
              do {
                uVar14 = uVar14 - 1;
                mc64ed_((int_t *)&local_d8,n,q,d__,l,&c__2);
                *piVar12 = (int)uVar6;
                l[(long)(int)uVar6 + -1] = uVar14;
                iperm = local_b0;
                piVar10 = local_c8;
                pdVar11 = local_d0;
                piVar13 = local_88;
                dVar18 = local_70;
                if (local_d8 == 0) break;
                uVar6 = (ulong)*q;
                piVar12 = piVar12 + -1;
              } while (d__[uVar6 - 1] <= local_90);
            }
            lVar8 = (long)q[local_a8 + -2];
            if (local_b8 <= d__[lVar8 + -1]) break;
            uVar5 = local_a8 + -1;
            lVar9 = (long)iperm[lVar8 + -1];
            dVar20 = (d__[lVar8 + -1] - pdVar11[(long)local_78[lVar9] + -1]) + u[lVar8 + -1];
            iVar2 = local_80[lVar9];
            local_a8 = uVar5;
            local_68 = dVar20;
            local_48 = lVar9;
            for (lVar8 = (long)local_80[lVar9 + -1]; lVar8 < iVar2; lVar8 = lVar8 + 1) {
              uVar15 = piVar10[lVar8 + -1];
              uVar6 = (ulong)uVar15;
              iVar3 = piVar13[(int)uVar15];
              local_d4 = uVar15;
              if (((long)iVar3 < (long)uVar5) &&
                 (dVar19 = (pdVar11[lVar8 + -1] + dVar20) - u[(long)(int)uVar15 + -1],
                 dVar19 < local_b8)) {
                if (iperm[(long)(int)uVar15 + -1] == 0) {
                  local_a0 = (uint)lVar9;
                  local_b8 = dVar19;
                  local_9c = (int_t)lVar8;
                }
                else if ((dVar19 < d__[(long)(int)uVar15 + -1]) && (iVar3 < (int)uVar14)) {
                  pos0 = (uint *)(piVar13 + (int)uVar15);
                  d__[(long)(int)uVar15 + -1] = dVar19;
                  if (dVar19 <= local_90) {
                    if (iVar3 != 0) {
                      local_50 = pos0;
                      mc64fd_((int_t *)pos0,(int_t *)&local_d8,n,q,d__,l,&c__2);
                      pos0 = local_50;
                      uVar5 = local_a8;
                      lVar9 = local_48;
                      piVar10 = local_c8;
                      pdVar11 = local_d0;
                      dVar18 = local_70;
                      dVar20 = local_68;
                    }
                    lVar16 = (long)(int)uVar14;
                    uVar14 = uVar14 - 1;
                    q[lVar16 + -2] = uVar15;
                    *pos0 = uVar14;
                  }
                  else {
                    if (iVar3 == 0) {
                      local_d8 = local_d8 + 1;
                      *pos0 = local_d8;
                    }
                    mc64dd_((int_t *)&local_d4,n,q,d__,l,&c__2);
                    uVar5 = local_a8;
                    lVar9 = local_48;
                    piVar10 = local_c8;
                    pdVar11 = local_d0;
                    dVar18 = local_70;
                    dVar20 = local_68;
                  }
                  iVar3 = local_b0[(long)(int)uVar15 + -1];
                  local_98[iVar3] = (int_t)lVar8;
                  pr[(long)iVar3 + -1] = (int_t)lVar9;
                  iperm = local_b0;
                }
              }
            }
            local_a8 = uVar5;
          }
          if ((local_b8 != dVar18) || (NAN(local_b8) || NAN(dVar18))) {
            *num = *num + 1;
            uVar6 = (ulong)piVar10[(long)local_9c + -1];
            iperm[uVar6 - 1] = local_a0;
            local_78[(int)local_a0] = local_9c;
            iVar2 = *num;
            if (iVar2 < 1) {
              iVar2 = 0;
            }
            uVar5 = (ulong)local_a0;
            while (bVar17 = iVar2 != 0, iVar2 = iVar2 + -1, bVar17) {
              iVar3 = (int)uVar5;
              uVar5 = (ulong)pr[(long)iVar3 + -1];
              if (uVar5 == 0xffffffffffffffff) break;
              iVar7 = local_98[iVar3];
              uVar6 = (ulong)piVar10[(long)iVar7 + -1];
              iperm[uVar6 - 1] = pr[(long)iVar3 + -1];
              local_78[uVar5] = iVar7;
            }
            lVar8 = (long)*n;
            for (; (long)local_a8 <= lVar8; local_a8 = local_a8 + 1) {
              uVar6 = (ulong)q[local_a8 + -1];
              u[uVar6 - 1] = (u[uVar6 - 1] + d__[uVar6 - 1]) - local_b8;
            }
          }
          else {
            lVar8 = (long)*n;
          }
          for (lVar9 = (long)(int)uVar14; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
            uVar6 = (ulong)q[lVar9 + -1];
            d__[uVar6 - 1] = dVar18;
            piVar13[uVar6] = 0;
          }
          uVar5 = (ulong)local_d8;
          if ((int)local_d8 < 1) {
            uVar5 = 0;
          }
          for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
            uVar6 = (ulong)q[uVar4];
            d__[uVar6 - 1] = dVar18;
            piVar13[uVar6] = 0;
          }
          local_d4 = (uint)uVar6;
          uVar5 = local_40;
          piVar13 = local_78;
        }
      }
      uVar15 = *n;
    }
  }
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar15) {
    uVar5 = (ulong)uVar15;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    lVar8 = (long)jperm[uVar4];
    if (lVar8 == 0) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = pdVar11[lVar8 + -1] - u[(long)piVar10[lVar8 + -1] + -1];
    }
    d__[uVar4] = dVar18;
    if (iperm[uVar4] == 0) {
      u[uVar4] = 0.0;
    }
  }
  if (*num != uVar15) {
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      jperm[uVar4] = 0;
    }
    uVar4 = 0;
    uVar5 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar5 = uVar4;
    }
    iVar2 = 0;
    while (uVar5 != uVar4) {
      iVar7 = iVar2 + 1;
      piVar10 = piVar13;
      iVar3 = iperm[uVar4];
      if (iperm[uVar4] == 0) {
        iVar2 = iVar7;
        piVar10 = local_98;
        iVar3 = iVar7;
      }
      uVar4 = uVar4 + 1;
      piVar10[iVar3] = (int_t)uVar4;
    }
    uVar4 = 0;
    uVar5 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar5 = uVar4;
    }
    iVar2 = 0;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if (jperm[uVar4] == 0) {
        lVar8 = (long)iVar2;
        iVar2 = iVar2 + 1;
        iperm[(long)local_98[lVar8 + 1] + -1] = (int)uVar4 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *out, int_t *pr, int_t *q, int_t *l, double *u, 
	double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, c__2 = 2;

    /* Local variables */
    int_t i__, j, k, i0, k0, k1, k2, q0;
    double di;
    int_t ii, jj, kk;
    double vj;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dmin__, dnew;
    int_t jord, qlen, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(K). It is not altered. */
/*   All values A(K) must be non-negative. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   weighted matching: IPERM(I) = 0 or row I is matched to column */
/*   IPERM(I). */
/* NUM is an INT_T variable. On exit, it contains the cardinality of */
/*   the matching stored in IPERM. */
/* IW is an INT_T work array of length 5N. */
/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length 2N. */
/*   On exit, U = D(1:N) contains the dual row variable and */
/*   V = D(N+1:2N) contains the dual column variable. If the matrix */
/*   is structurally nonsingular (NUM = N), the following holds: */
/*      U(I)+V(J) <= A(I,J)  if IPERM(I) |= J */
/*      U(I)+V(J)  = A(I,J)  if IPERM(I)  = J */
/*      U(I) = 0  if IPERM(I) = 0 */
/*      V(J) = 0  if there is no I for which IPERM(I) = J */
/* Local variables */
/* Local parameters */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD */
/*      DOUBLE PRECISION FD05AD */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --u;
    --l;
    --q;
    --pr;
    --out;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	u[k] = rinf;
	d__[k] = 0.;
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	l[k] = 0;
/* L10: */
    }
/* Initialize U(I) */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] > u[i__]) {
		goto L20;
	    }
	    u[i__] = a[k];
	    iperm[i__] = j;
	    l[i__] = k;
L20:
	    ;
	}
/* L30: */
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = iperm[i__];
	if (j == 0) {
	    goto L40;
	}
/* Row I is not empty */
	iperm[i__] = 0;
	if (jperm[j] != 0) {
	    goto L40;
	}
/* Assignment of column J to row I */
	++(*num);
	iperm[i__] = j;
	jperm[j] = l[i__];
L40:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Scan unassigned columns; improve assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* JPERM(J) ne 0 iff column J is already assigned */
	if (jperm[j] != 0) {
	    goto L95;
	}
	k1 = ip[j];
	k2 = ip[j + 1] - 1;
/* Continue only if column J is not empty */
	if (k1 > k2) {
	    goto L95;
	}
	vj = rinf;
	i__2 = k2;
	for (k = k1; k <= i__2; ++k) {
	    i__ = irn[k];
	    di = a[k] - u[i__];
	    if (di > vj) {
		goto L50;
	    }
	    if (di < vj || di == rinf) {
		goto L55;
	    }
	    if (iperm[i__] != 0 || iperm[i0] == 0) {
		goto L50;
	    }
L55:
	    vj = di;
	    i0 = i__;
	    k0 = k;
L50:
	    ;
	}
	d__[j] = vj;
	k = k0;
	i__ = i0;
	if (iperm[i__] == 0) {
	    goto L90;
	}
	i__2 = k2;
	for (k = k0; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] - u[i__] > vj) {
		goto L60;
	    }
	    jj = iperm[i__];
/* Scan remaining part of assigned column JJ */
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L60;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] > 0) {
		    goto L70;
		}
		if (a[kk] - u[ii] <= d__[jj]) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L60:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = kk;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = k;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = rinf;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
/* JORD is next unmatched column */
/* DMIN is the length of shortest path in the tree */
	dmin__ = rinf;
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is the cost of the shortest augmenting path to unassigned row */
/* IRN(ISP). The corresponding column index is JSP. */
	csp = rinf;
/* Build shortest path tree starting from unassigned column (root) JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = a[k] - u[i__];
	    if (dnew >= csp) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
		csp = dnew;
		isp = k;
		jsp = j;
	    } else {
		if (dnew < dmin__) {
		    dmin__ = dnew;
		}
		d__[i__] = dnew;
		++qlen;
		q[qlen] = k;
	    }
L115:
	    ;
	}
/* Initialize heap Q and Q2 with rows held in Q(1:QLEN) */
	q0 = qlen;
	qlen = 0;
	i__2 = q0;
	for (kk = 1; kk <= i__2; ++kk) {
	    k = q[kk];
	    i__ = irn[k];
	    if (csp <= d__[i__]) {
		d__[i__] = rinf;
		goto L120;
	    }
	    if (d__[i__] <= dmin__) {
		--low;
		q[low] = i__;
		l[i__] = low;
	    } else {
		++qlen;
		l[i__] = qlen;
		mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
	    }
/* Update tree */
	    jj = iperm[i__];
	    out[jj] = k;
	    pr[jj] = j;
L120:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (d__[i__] >= csp) {
		    goto L160;
		}
		dmin__ = d__[i__];
L152:
		mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__2);
		--low;
		q[low] = i__;
		l[i__] = low;
		if (qlen == 0) {
		    goto L153;
		}
		i__ = q[1];
		if (d__[i__] > dmin__) {
		    goto L153;
		}
		goto L152;
	    }
/* Q0 is row whose distance D(Q0) to the root is smallest */
L153:
	    q0 = q[up - 1];
	    dq0 = d__[q0];
/* Exit loop if path to Q0 is longer than the shortest augmenting path */
	    if (dq0 >= csp) {
		goto L160;
	    }
	    --up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    vj = dq0 - a[jperm[j]] + u[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
		if (l[i__] >= up) {
		    goto L155;
		}
/* DNEW is new cost */
		dnew = vj + a[k] - u[i__];
/* Do not update D(I) if DNEW ge cost of shortest path */
		if (dnew >= csp) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unmatched; update shortest path info */
		    csp = dnew;
		    isp = k;
		    jsp = j;
		} else {
/* Row I is matched; do not update D(I) if DNEW is larger */
		    di = d__[i__];
		    if (di <= dnew) {
			goto L155;
		    }
		    if (l[i__] >= low) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew <= dmin__) {
			if (l[i__] != 0) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__2);
			}
			--low;
			q[low] = i__;
			l[i__] = low;
		    } else {
			if (l[i__] == 0) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
		    }
/* Update tree */
		    jj = iperm[i__];
		    out[jj] = k;
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = RINF, no augmenting path is found */
L160:
	if (csp == rinf) {
	    goto L190;
	}
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = irn[isp];
	iperm[i__] = jsp;
	jperm[jsp] = isp;
	j = jsp;
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    jj = pr[j];
	    if (jj == -1) {
		goto L180;
	    }
	    k = out[j];
	    i__ = irn[k];
	    iperm[i__] = jj;
	    jperm[jj] = k;
	    j = jj;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
/* Update U for rows in Q(UP:N) */
L180:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    u[i__] = u[i__] + d__[i__] - csp;
/* L185: */
	}
L190:
	i__2 = *n;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* Set dual column variable in D(1:N) */
L1000:
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	k = jperm[j];
	if (k != 0) {
	    d__[j] = a[k] - u[irn[k]];
	} else {
	    d__[j] = 0.;
	}
	if (iperm[j] == 0) {
	    u[j] = 0.;
	}
/* L200: */
    }
    if (*num == *n) {
	goto L1100;
    }
/* The matrix is structurally singular, complete IPERM. */
/* JPERM, OUT are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    out[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L320;
	}
	++k;
	jdum = out[k];
	iperm[jdum] = j;
L320:
	;
    }
L1100:
    return 0;
}